

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void dccvap_writefn(CPUARMState_conflict *env,ARMCPRegInfo_conflict *opaque,uint64_t value)

{
  uintptr_t unaff_retaddr;
  MemoryRegion *mr;
  ram_addr_t offset;
  void *pvStack_50;
  int mem_idx;
  void *haddr;
  uint64_t vaddr;
  uint64_t vaddr_in;
  uint64_t dline_size;
  uc_struct_conflict2 *uc;
  ARMCPU_conflict1 *cpu;
  uint64_t value_local;
  ARMCPRegInfo_conflict *opaque_local;
  CPUARMState_conflict *env_local;
  
  cpu = (ARMCPU_conflict1 *)value;
  value_local = (uint64_t)opaque;
  opaque_local = (ARMCPRegInfo_conflict *)env;
  uc = (uc_struct_conflict2 *)env_archcpu(env);
  dline_size = (uint64_t)opaque_local[0x5d].readfn;
  vaddr_in = (uint64_t)(4 << ((byte)(((ArchCPU_conflict2 *)uc)->ctr >> 0x10) & 0xf));
  vaddr = (uint64_t)cpu;
  haddr = (void *)((ulong)cpu & (vaddr_in - 1 ^ 0xffffffffffffffff));
  offset._4_4_ = cpu_mmu_index((CPUARMState_conflict *)opaque_local,false);
  pvStack_50 = probe_read((CPUArchState_conflict1 *)opaque_local,(target_ulong)haddr,(int)vaddr_in,
                          offset._4_4_,unaff_retaddr);
  if (pvStack_50 != (void *)0x0) {
    memory_region_from_host_aarch64((uc_struct_conflict2 *)dline_size,pvStack_50,(ram_addr_t *)&mr);
  }
  return;
}

Assistant:

static void dccvap_writefn(CPUARMState *env, const ARMCPRegInfo *opaque,
                          uint64_t value)
{
    ARMCPU *cpu = env_archcpu(env);
    struct uc_struct *uc = env->uc;
    /* CTR_EL0 System register -> DminLine, bits [19:16] */
    uint64_t dline_size = 4 << ((cpu->ctr >> 16) & 0xF);
    uint64_t vaddr_in = (uint64_t) value;
    uint64_t vaddr = vaddr_in & ~(dline_size - 1);
    void *haddr;
    int mem_idx = cpu_mmu_index(env, false);

    /* This won't be crossing page boundaries */
    haddr = probe_read(env, vaddr, dline_size, mem_idx, GETPC());
    if (haddr) {

        ram_addr_t offset;
        MemoryRegion *mr;

        /* RCU lock is already being held */
        mr = memory_region_from_host(uc, haddr, &offset);
        if (mr) {
            // memory_region_do_writeback(mr, offset, dline_size); FIXME
        }
    }
}